

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall google::protobuf::DescriptorPool::Tables::RollbackToLastCheckpoint(Tables *this)

{
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  LogMessage *other;
  reference pvVar4;
  size_type sVar5;
  reference ppcVar6;
  reference __x;
  ulong local_d0;
  size_t i_2;
  ulong local_b8;
  size_t i_1;
  StringPiece local_a8;
  undefined1 local_98 [8];
  QueryKey name;
  size_t i;
  CheckPoint *checkpoint;
  byte local_49;
  LogMessage local_48;
  Tables *local_10;
  Tables *this_local;
  
  local_10 = this;
  bVar3 = std::
          vector<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
          ::empty(&this->checkpoints_);
  local_49 = 0;
  if (bVar3) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x577);
    local_49 = 1;
    other = internal::LogMessage::operator<<(&local_48,"CHECK failed: !checkpoints_.empty(): ");
    internal::LogFinisher::operator=((LogFinisher *)((long)&checkpoint + 3),other);
  }
  if ((local_49 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_48);
  }
  pvVar4 = std::
           vector<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
           ::back(&this->checkpoints_);
  for (name._32_8_ = SEXT48(pvVar4->pending_symbols_before_checkpoint); uVar2 = name._32_8_,
      sVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                        (&this->symbols_after_checkpoint_), (ulong)uVar2 < sVar5;
      name._32_8_ = name._32_8_ + 1) {
    Symbol::QueryKey::QueryKey((QueryKey *)local_98);
    ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&this->symbols_after_checkpoint_,name._32_8_);
    stringpiece_internal::StringPiece::StringPiece(&local_a8,*ppcVar6);
    name._0_8_ = local_a8.ptr_;
    name.name.ptr_ = (char *)local_a8.length_;
    Symbol::Symbol((Symbol *)&i_1,(QueryKey *)local_98);
    std::
    unordered_set<google::protobuf::Symbol,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
    ::erase(&this->symbols_by_name_,(key_type *)&i_1);
  }
  for (local_b8 = (ulong)pvVar4->pending_files_before_checkpoint; uVar1 = local_b8,
      sVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                        (&this->files_after_checkpoint_), uVar1 < sVar5; local_b8 = local_b8 + 1) {
    ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&this->files_after_checkpoint_,local_b8);
    stringpiece_internal::StringPiece::StringPiece((StringPiece *)&i_2,*ppcVar6);
    std::
    unordered_map<google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*,_google::protobuf::hash<google::protobuf::stringpiece_internal::StringPiece>,_std::equal_to<google::protobuf::stringpiece_internal::StringPiece>,_std::allocator<std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>_>_>
    ::erase(&this->files_by_name_,(key_type *)&i_2);
  }
  for (local_d0 = (ulong)pvVar4->pending_extensions_before_checkpoint;
      sVar5 = std::
              vector<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
              ::size(&this->extensions_after_checkpoint_), local_d0 < sVar5; local_d0 = local_d0 + 1
      ) {
    __x = std::
          vector<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
          ::operator[](&this->extensions_after_checkpoint_,local_d0);
    std::
    map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
    ::erase(&this->extensions_,__x);
  }
  std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
            (&this->symbols_after_checkpoint_,(long)pvVar4->pending_symbols_before_checkpoint);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
            (&this->files_after_checkpoint_,(long)pvVar4->pending_files_before_checkpoint);
  std::
  vector<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
  ::resize(&this->extensions_after_checkpoint_,(long)pvVar4->pending_extensions_before_checkpoint);
  anon_unknown_1::TableArena::RollbackTo(&this->arena_,(long)pvVar4->arena_before_checkpoint);
  std::
  vector<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
  ::pop_back(&this->checkpoints_);
  return;
}

Assistant:

void DescriptorPool::Tables::RollbackToLastCheckpoint() {
  GOOGLE_DCHECK(!checkpoints_.empty());
  const CheckPoint& checkpoint = checkpoints_.back();

  for (size_t i = checkpoint.pending_symbols_before_checkpoint;
       i < symbols_after_checkpoint_.size(); i++) {
    Symbol::QueryKey name;
    name.name = symbols_after_checkpoint_[i];
    symbols_by_name_.erase(Symbol(&name));
  }
  for (size_t i = checkpoint.pending_files_before_checkpoint;
       i < files_after_checkpoint_.size(); i++) {
    files_by_name_.erase(files_after_checkpoint_[i]);
  }
  for (size_t i = checkpoint.pending_extensions_before_checkpoint;
       i < extensions_after_checkpoint_.size(); i++) {
    extensions_.erase(extensions_after_checkpoint_[i]);
  }

  symbols_after_checkpoint_.resize(
      checkpoint.pending_symbols_before_checkpoint);
  files_after_checkpoint_.resize(checkpoint.pending_files_before_checkpoint);
  extensions_after_checkpoint_.resize(
      checkpoint.pending_extensions_before_checkpoint);

  arena_.RollbackTo(checkpoint.arena_before_checkpoint);
  checkpoints_.pop_back();
}